

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginMainMenuBar(void)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiContext *g;
  ImVec2 local_10;
  
  pIVar3 = GImGui;
  (pIVar3->SetNextWindowPosVal).x = 0.0;
  (pIVar3->SetNextWindowPosVal).y = 0.0;
  pIVar3->SetNextWindowPosCond = 1;
  pIVar3->SetNextWindowSizeCond = 1;
  fVar1 = (pIVar3->Style).FramePadding.y;
  fVar2 = pIVar3->FontBaseSize;
  (pIVar3->SetNextWindowSizeVal).x = (pIVar3->IO).DisplaySize.x;
  (pIVar3->SetNextWindowSizeVal).y = fVar1 + fVar1 + fVar2;
  PushStyleVar(2,0.0);
  local_10.x = 0.0;
  local_10.y = 0.0;
  PushStyleVar(3,&local_10);
  bVar4 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  if ((bVar4) && (bVar4 = BeginMenuBar(), bVar4)) {
    (pIVar3->CurrentWindow->DC).MenuBarOffsetX =
         (pIVar3->Style).DisplaySafeAreaPadding.x + (pIVar3->CurrentWindow->DC).MenuBarOffsetX;
    return true;
  }
  End();
  PopStyleVar(2);
  return false;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.FontBaseSize + g.Style.FramePadding.y * 2.0f));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0,0));
    if (!Begin("##MainMenuBar", NULL, ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoScrollbar|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_MenuBar)
        || !BeginMenuBar())
    {
        End();
        PopStyleVar(2);
        return false;
    }
    g.CurrentWindow->DC.MenuBarOffsetX += g.Style.DisplaySafeAreaPadding.x;
    return true;
}